

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *js,char *identifier)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (identifier == (char *)0x0) {
    __assert_fail("identifier != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x14c,
                  "int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *, char *)"
                 );
  }
  iVar6 = js->buffer_end;
  iVar5 = iVar6 - js->buffer_start;
  iVar4 = (iVar6 + 0x12) - js->buffer_start;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  if (0 < iVar4) {
    uVar3 = (iVar6 + -1) % 0x12;
    uVar1 = uVar3 + 0x12;
    if (-1 < (int)uVar3) {
      uVar1 = uVar3;
    }
    bVar2 = js->buffer[uVar1];
    iVar6 = -2;
    iVar4 = iVar6;
    if ((((ulong)bVar2 < 0x21) && ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
       (bVar2 == 0xa0)) goto LAB_00130fd0;
  }
  iVar6 = -1;
  iVar4 = iVar6;
LAB_00130fd0:
  while (((bVar2 = jsparser_buffer_get(js,iVar6), (byte)(bVar2 - 0x30) < 10 ||
          ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) || ((bVar2 == 0x5f || (bVar2 == 0x24))))) {
    iVar6 = iVar6 + -1;
  }
  iVar6 = iVar6 + 1;
  if (iVar4 <= iVar6) {
    *identifier = '\0';
  }
  else {
    jsparser_buffer_slice(js,identifier,iVar6,iVar4);
  }
  return (uint)(iVar4 > iVar6);
}

Assistant:

int jsparser_buffer_last_identifier(jsparser_ctx *js, char *identifier)
{
  int end;
  int pos;

  assert(identifier != NULL);

  end = -1;
  /* Ignore the optional whitespace delimiter */
  if (js_is_whitespace(jsparser_buffer_get(js, -1))) {
    --end;
  }

  /* Find the beginning of the identifier. This loop ends either when we find a
   * character that doesn't belong to an identifier, or when we find a '\0'
   * character, which means we reached the end of the buffer. */
  for(pos = end; js_is_identifier(jsparser_buffer_get(js, pos)); --pos) {
  }
  if (pos + 1 >= end) {
    identifier[0] = '\0';
    return 0;
  }

  jsparser_buffer_slice(js, identifier, pos + 1, end);
  return 1;
}